

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkCRetime(Abc_Ntk_t *pNtk,int fVerbose)

{
  void **ppvVar1;
  long *plVar2;
  int *piVar3;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *vControls;
  Vec_Int_t *vClasses;
  Abc_Obj_t *pAVar4;
  ulong uVar5;
  Abc_Obj_t *pAVar6;
  char *pName;
  Abc_Ntk_t *pNtkNew;
  ulong uVar7;
  uint uVar8;
  void *pvVar9;
  uint uVar10;
  int i;
  uint local_44;
  uint local_40;
  uint local_3c;
  Vec_Int_t *vFlopClassesNew;
  
  pNtk_00 = Abc_NtkDup(pNtk);
  vControls = Vec_PtrAlloc(100);
  vClasses = Vec_IntAlloc(100);
  i = 0;
  uVar10 = 0;
  local_40 = 0;
  local_3c = 0;
  local_44 = 0;
  do {
    if (pNtk_00->vBoxes->nSize <= i) {
      if (local_3c != 0) {
        printf("Opposite phase enable is present in %d flops (out of %d).\n",(ulong)local_3c,
               (ulong)(uint)pNtk_00->nObjCounts[8]);
      }
      uVar8 = vControls->nSize;
      if (fVerbose != 0) {
        printf("CountN = %4d. Count2 = %4d. Count1 = %4d. Count0 = %4d. Ctrls = %d.\n",(ulong)uVar10
               ,(ulong)local_40,(ulong)local_3c,(ulong)local_44,(ulong)uVar8);
      }
      uVar10 = 0;
      if ((int)uVar8 < 1) {
        uVar8 = uVar10;
      }
      for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vControls,uVar10);
        pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
        Abc_ObjAddFanin(pAVar6,pAVar4);
        pName = Abc_ObjName(pAVar6);
        Abc_ObjAssignName(pAVar6,pName,(char *)0x0);
        Vec_PtrWriteEntry(vControls,uVar10,pAVar6);
      }
      Abc_NtkOrderCisCos(pNtk_00);
      Abc_NtkCleanup(pNtk_00,fVerbose);
      pNtkNew = Abc_NtkRetimeWithClassesNtk(pNtk_00,vClasses,&vFlopClassesNew,fVerbose);
      Abc_NtkTransformBack(pNtk_00,pNtkNew,vControls,vFlopClassesNew);
      Abc_NtkDelete(pNtk_00);
      Vec_PtrFree(vControls);
      Vec_IntFree(vFlopClassesNew);
      return pNtkNew;
    }
    pAVar4 = Abc_NtkBox(pNtk_00,i);
    if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
      ppvVar1 = pAVar4->pNtk->vObjs->pArray;
      plVar2 = (long *)ppvVar1[*(pAVar4->vFanins).pArray];
      pAVar6 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      if ((pAVar6->vFanins).nSize == 3) {
        pvVar9 = ppvVar1[*(pAVar4->vFanouts).pArray];
        piVar3 = (pAVar6->vFanins).pArray;
        ppvVar1 = pAVar6->pNtk->vObjs->pArray;
        if (ppvVar1[piVar3[1]] == pvVar9) {
          Vec_IntPush(vClasses,-1);
          local_3c = local_3c + 1;
        }
        else if (ppvVar1[piVar3[2]] == pvVar9) {
          local_44 = local_44 + 1;
          pvVar9 = ppvVar1[*piVar3];
          uVar8 = vControls->nSize;
          if (vControls->nSize < 1) {
            uVar8 = 0;
          }
          uVar7 = (ulong)uVar8;
          uVar5 = 0;
          do {
            if (uVar7 == uVar5) {
              Vec_PtrPush(vControls,pvVar9);
              pvVar9 = pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
              uVar7 = (ulong)(uint)vControls->nSize;
              if (vControls->nSize < 1) {
                uVar7 = 0;
              }
              break;
            }
            ppvVar1 = vControls->pArray + uVar5;
            uVar5 = uVar5 + 1;
          } while (*ppvVar1 != pvVar9);
          for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
            if (vControls->pArray[uVar5] == pvVar9) goto LAB_006b0373;
          }
          uVar5 = 0xffffffffffffffff;
LAB_006b0373:
          Vec_IntPush(vClasses,(int)uVar5);
          Abc_ObjPatchFanin((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray],
                            pAVar6,(Abc_Obj_t *)
                                   pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[1]]);
        }
        else {
          Vec_IntPush(vClasses,-1);
          local_40 = local_40 + 1;
        }
      }
      else {
        Vec_IntPush(vClasses,-1);
        uVar10 = uVar10 + 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkCRetime( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Ptr_t * vControls;
    Vec_Int_t * vFlopClasses, * vFlopClassesNew;
    Abc_Obj_t * pObj, * pDriver, * pFlopOut, * pObjPo;
    int i, iFlop, CountN = 0, Count2 = 0, Count1 = 0, Count0 = 0;

    // duplicate the AIG
    pNtk = Abc_NtkDup( pNtk );

    // update registers
    vControls    = Vec_PtrAlloc( 100 );
    vFlopClasses = Vec_IntAlloc( 100 );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        pFlopOut = Abc_ObjFanout0(pObj);
        pDriver = Abc_ObjFanin0( Abc_ObjFanin0(pObj) );
        if ( Abc_ObjFaninNum(pDriver) != 3 )
        {
            Vec_IntPush( vFlopClasses, -1 );
            CountN++;
            continue;
        }
        if ( Abc_ObjFanin(pDriver, 1) != pFlopOut && Abc_ObjFanin(pDriver, 2) != pFlopOut )
        {
            Vec_IntPush( vFlopClasses, -1 );
            Count2++;
            continue;
        }
        if ( Abc_ObjFanin(pDriver, 1) == pFlopOut )
        {
            Vec_IntPush( vFlopClasses, -1 );
            Count1++;
            continue;
        }
        assert( Abc_ObjFanin(pDriver, 2) == pFlopOut );
        Count0++;
        Vec_PtrPushUnique( vControls, Abc_ObjFanin0(pDriver) );
        // set the flop class
        iFlop = Vec_PtrFind( vControls, Abc_ObjFanin0(pDriver) );
        Vec_IntPush( vFlopClasses, iFlop );
        // update
        Abc_ObjPatchFanin( Abc_ObjFanin0(pObj), pDriver, Abc_ObjFanin(pDriver, 1) );
    }
    if ( Count1 )
        printf( "Opposite phase enable is present in %d flops (out of %d).\n", Count1, Abc_NtkLatchNum(pNtk) );
    if ( fVerbose )
    printf( "CountN = %4d. Count2 = %4d. Count1 = %4d. Count0 = %4d. Ctrls = %d.\n", 
        CountN, Count2, Count1, Count0, Vec_PtrSize(vControls) );

    // add the controls to the list of POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vControls, pObj, i )
    {
        pObjPo = Abc_NtkCreatePo( pNtk );
        Abc_ObjAddFanin( pObjPo, pObj );
        Abc_ObjAssignName( pObjPo, Abc_ObjName(pObjPo), NULL );
        Vec_PtrWriteEntry( vControls, i, pObjPo );
    }
    Abc_NtkOrderCisCos( pNtk );
    Abc_NtkCleanup( pNtk, fVerbose );

    // performs retiming with classes
    pNtkNew = Abc_NtkRetimeWithClassesNtk( pNtk, vFlopClasses, &vFlopClassesNew, fVerbose );
    Abc_NtkTransformBack( pNtk, pNtkNew, vControls, vFlopClassesNew );
//    assert( Abc_NtkPoNum(pNtkNew) == Abc_NtkPoNum(pNtk) );
    Abc_NtkDelete( pNtk );

    Vec_PtrFree( vControls );
//    Vec_IntFree( vFlopClasses );
    Vec_IntFree( vFlopClassesNew );
    return pNtkNew;
}